

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void gl4cts::EnhancedLayouts::Utils::VertexArray::AttribPointer
               (Functions *gl,GLuint index,Type *type,GLuint n_array_elements,GLboolean normalized,
               GLsizei stride,GLvoid *pointer)

{
  GLuint GVar1;
  TYPES TVar2;
  GLuint GVar3;
  GLenum GVar4;
  GLenum GVar5;
  void *pvVar6;
  TestError *this;
  GLvoid *ptr;
  GLuint column;
  GLuint element;
  GLuint offset;
  GLenum gl_type;
  GLuint column_size;
  GLint size;
  GLuint basic_type_size;
  GLsizei stride_local;
  GLboolean normalized_local;
  GLuint n_array_elements_local;
  Type *type_local;
  GLuint index_local;
  Functions *gl_local;
  
  GVar3 = Utils::Type::GetTypeSize(type->m_basic_type);
  GVar1 = type->m_n_rows;
  GVar4 = Utils::Type::GetTypeGLenum(type->m_basic_type);
  column = 0;
  stride_local = n_array_elements;
  if (n_array_elements == 0) {
    stride_local = 1;
  }
  ptr._4_4_ = 0;
  type_local._4_4_ = index;
  do {
    if ((uint)stride_local <= ptr._4_4_) {
      return;
    }
    for (ptr._0_4_ = 1; (uint)ptr <= type->m_n_columns; ptr._0_4_ = (uint)ptr + 1) {
      pvVar6 = (void *)((long)pointer + (ulong)column);
      TVar2 = type->m_basic_type;
      if (TVar2 == Float) {
        (*gl->vertexAttribPointer)(type_local._4_4_,GVar1,GVar4,normalized,stride,pvVar6);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"VertexAttribPointer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                        ,0xe19);
      }
      else if (TVar2 == Double) {
        (*gl->vertexAttribLPointer)(type_local._4_4_,GVar1,GVar4,stride,pvVar6);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"VertexAttribLPointer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                        ,0xe22);
      }
      else {
        if (1 < TVar2 - Int) {
          this = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this,"Invalid enum",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                     ,0xe25);
          __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (*gl->vertexAttribIPointer)(type_local._4_4_,GVar1,GVar4,stride,pvVar6);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"VertexAttribIPointer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                        ,0xe1e);
      }
      column = GVar1 * GVar3 + column;
      type_local._4_4_ = type_local._4_4_ + 1;
    }
    ptr._4_4_ = ptr._4_4_ + 1;
  } while( true );
}

Assistant:

void VertexArray::AttribPointer(const Functions& gl, GLuint index, const Type& type, GLuint n_array_elements,
								GLboolean normalized, GLsizei stride, const GLvoid* pointer)
{
	const GLuint basic_type_size = Type::GetTypeSize(type.m_basic_type);
	const GLint  size			 = (GLint)type.m_n_rows;
	const GLuint column_size	 = (GLuint)size * basic_type_size;
	const GLenum gl_type		 = Type::GetTypeGLenum(type.m_basic_type);

	GLuint offset = 0;

	/* If attribute is not an array */
	if (0 == n_array_elements)
	{
		n_array_elements = 1;
	}

	/* For each element in array */
	for (GLuint element = 0; element < n_array_elements; ++element)
	{
		/* For each column in matrix */
		for (GLuint column = 1; column <= type.m_n_columns; ++column)
		{
			/* Calculate offset */
			const GLvoid* ptr = (GLubyte*)pointer + offset;

			/* Set up attribute */
			switch (type.m_basic_type)
			{
			case Type::Float:
				gl.vertexAttribPointer(index, size, gl_type, normalized, stride, ptr);
				GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribPointer");
				break;
			case Type::Int:
			case Type::Uint:
				gl.vertexAttribIPointer(index, size, gl_type, stride, ptr);
				GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribIPointer");
				break;
			case Type::Double:
				gl.vertexAttribLPointer(index, size, gl_type, stride, ptr);
				GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribLPointer");
				break;
			default:
				TCU_FAIL("Invalid enum");
			}

			/* Next location */
			offset += column_size;
			index += 1;
		}
	}
}